

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_LookEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  VMValue *pVVar5;
  undefined4 extraout_var_00;
  FState *newstate;
  AActor *pAVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar7;
  AActor *pAVar8;
  FSoundID *sound_id;
  AActor *this;
  FState *newstate_00;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  undefined4 uVar13;
  float attenuation;
  undefined4 uVar14;
  FLookExParams params;
  NActorIterator iterator;
  double local_b0;
  double local_a8;
  void *local_a0;
  FSoundID local_94;
  FSoundID local_90;
  FName local_8c;
  double local_88;
  undefined8 uStack_80;
  FLookExParams local_70;
  NActorIterator local_40;
  PClass *pPVar4;
  PClassActor *cls;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003f4e19;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f4e09:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f4e19:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003f4803;
    pPVar4 = (this->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar11 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar11) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar11 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f4e19;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003f4e09;
LAB_003f4803:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pVVar5 = defaultparam->Array;
    if (pVVar5[1].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f4ec6:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x817,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar10 = pVVar5[1].field_0.i;
LAB_003f4859:
    if (pVVar5[2].field_0.field_3.Type != '\x01') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f4ee5:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x818,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a0 = pVVar5[2].field_0.field_1.a;
LAB_003f486e:
    if (pVVar5[3].field_0.field_3.Type != '\x01') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f4e95:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x819,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a8 = pVVar5[3].field_0.f;
LAB_003f4883:
    if (pVVar5[4].field_0.field_3.Type != '\x01') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f4e76:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81a,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_b0 = pVVar5[4].field_0.f;
LAB_003f4892:
    if (pVVar5[5].field_0.field_3.Type != '\x01') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f4e57:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81b,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar13 = (undefined4)*(undefined8 *)&pVVar5[5].field_0;
    uVar14 = (undefined4)((ulong)*(undefined8 *)&pVVar5[5].field_0 >> 0x20);
LAB_003f48a1:
    if (pVVar5[6].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f4e38:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81c,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_88 = (double)CONCAT44(uVar14,uVar13);
    iVar2 = pVVar5[6].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar9 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f4ec6;
    }
    uVar10 = param[1].field_0.i;
    if (numparam < 3) {
      pVVar5 = defaultparam->Array;
      goto LAB_003f4859;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f4ee5;
    }
    local_a0 = (void *)param[2].field_0.f;
    if (numparam == 3) {
      pVVar5 = defaultparam->Array;
      goto LAB_003f486e;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f4e95;
    }
    local_a8 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      pVVar5 = defaultparam->Array;
      goto LAB_003f4883;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f4e76;
    }
    local_b0 = param[4].field_0.f;
    if (numparam == 5) {
      pVVar5 = defaultparam->Array;
      goto LAB_003f4892;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f4e57;
    }
    local_88 = *(double *)&param[5].field_0;
    uVar13 = SUB84(local_88,0);
    uVar14 = (undefined4)((ulong)local_88 >> 0x20);
    if ((uint)numparam < 7) {
      pVVar5 = defaultparam->Array;
      goto LAB_003f48a1;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar9 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f4e38;
    }
    iVar2 = param[6].field_0.i;
  }
  uStack_80 = 0;
  cls = (PClassActor *)(this->super_DThinker).super_DObject.Class;
  if (cls == (PClassActor *)0x0) {
    iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    cls = (PClassActor *)CONCAT44(extraout_var_00,iVar3);
    (this->super_DThinker).super_DObject.Class = (PClass *)cls;
  }
  newstate = FStateLabelStorage::GetState(&StateLabels,iVar2,cls,false);
  local_70.Fov.Degrees =
       (double)(~-(ulong)(local_88 == 0.0) & (ulong)local_88 |
               (ulong)((uint)(-(ulong)(local_88 == 0.0) >> 0x20) & 0x40668000) << 0x20);
  local_70.minDist = (double)local_a0;
  local_70.maxDist = local_a8;
  local_70.maxHeardist = local_b0;
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  local_70.flags = uVar10;
  local_70.seestate = newstate;
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    local_40.super_FActorIterator.id = this->args[1];
    local_40.super_FActorIterator.base = (AActor *)0x0;
    local_8c.Index = 0x111;
    local_40.type = PClass::FindClass(&local_8c);
    this->special = 0;
    pAVar6 = NActorIterator::Next(&local_40);
    (this->goal).field_0.p = pAVar6;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if ((uVar10 & 2) == 0) {
      if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
        paVar7 = &(this->LastHeard).field_0;
      }
      else {
        paVar7 = &(this->Sector->SoundTarget).field_0;
      }
      pAVar6 = paVar7->p;
      if (pAVar6 != (AActor *)0x0) {
        if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (pAVar6->health < 1) goto LAB_003f4ae2;
          dVar12 = AActor::Distance2D(this,pAVar6,false);
          if (((local_b0 == 0.0) && (!NAN(local_b0))) || (dVar12 <= local_b0)) {
            if ((pAVar6->player != (player_t *)0x0) && ((pAVar6->player->cheats & 8) != 0)) {
              return 0;
            }
            goto LAB_003f4ae5;
          }
          paVar7 = &(this->LastHeard).field_0;
        }
LAB_003f4adb:
        *paVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
      }
    }
LAB_003f4ae2:
    pAVar6 = (AActor *)0x0;
  }
  else {
    pAVar6 = (this->target).field_0.p;
    if (pAVar6 == (AActor *)0x0) goto LAB_003f4ae2;
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      paVar7 = &(this->target).field_0;
      goto LAB_003f4adb;
    }
  }
LAB_003f4ae5:
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((pAVar6 == (AActor *)0x0) || (((pAVar6->flags).Value & 4) == 0)) goto LAB_003f4cca;
  bVar11 = AActor::IsFriend(this,pAVar6);
  if (bVar11) {
    if (((this->flags4).Value & 0x20000) == 0) {
      if (((uVar10 & 1) == 0) && (bVar11 = P_LookForPlayers(this,1,&local_70), bVar11))
      goto LAB_003f4cee;
      if (((this->flags).Value & 0x2000) == 0) {
        newstate_00 = newstate;
        if ((newstate == (FState *)0x0) &&
           (newstate_00 = this->SeeState, this->SeeState == (FState *)0x0)) {
          A_Wander(this,0);
        }
        else {
          AActor::SetState(this,newstate_00,false);
        }
      }
    }
LAB_003f4cca:
    if ((uVar10 & 1) != 0) {
      return 0;
    }
    bVar11 = P_LookForPlayers(this,1,&local_70);
    if (!bVar11) {
      return 0;
    }
  }
  else {
    (this->target).field_0.p = pAVar6;
    pAVar8 = (AActor *)0x0;
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar8 = pAVar6;
    }
    (this->target).field_0.p = pAVar8;
    if (pAVar8 == this) {
LAB_003f4c44:
      (this->target).field_0.p = (AActor *)0x0;
      goto LAB_003f4cca;
    }
    if (pAVar8 == (AActor *)0x0) goto LAB_003f4cca;
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_003f4c44;
    if (((this->flags).Value & 0x20) == 0) goto LAB_003f4cee;
    dVar12 = AActor::Distance2D(this,pAVar8,false);
    pAVar6 = (this->target).field_0.p;
    if (pAVar6 == (AActor *)0x0) {
LAB_003f4bd8:
      pAVar6 = (AActor *)0x0;
    }
    else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->target).field_0.p = (AActor *)0x0;
      goto LAB_003f4bd8;
    }
    bVar11 = P_CheckSight(this,pAVar6,4);
    if (((!bVar11) ||
        ((((double)local_a0 != 0.0 || (NAN((double)local_a0))) && (dVar12 <= (double)local_a0)))) ||
       (((local_a8 != 0.0 || (NAN(local_a8))) && (local_a8 <= dVar12)))) goto LAB_003f4cca;
  }
LAB_003f4cee:
  pAVar6 = (this->goal).field_0.p;
  if (pAVar6 == (AActor *)0x0) {
LAB_003f4d0b:
    pAVar6 = (AActor *)0x0;
  }
  else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->goal).field_0.p = (AActor *)0x0;
    goto LAB_003f4d0b;
  }
  pAVar8 = (this->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_003f4d2a:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_003f4d2a;
  }
  if (pAVar8 == pAVar6) {
    if (level.maptime < this->reactiontime) goto LAB_003f4dcd;
  }
  else {
    iVar2 = (this->SeeSound).super_FSoundID.ID;
    if ((iVar2 != 0) && ((uVar10 & 8) == 0)) {
      if ((uVar10 & 0x10) == 0) {
        sound_id = &local_94;
        attenuation = 1.0;
        local_94.ID = iVar2;
      }
      else {
        sound_id = &local_90;
        attenuation = 0.0;
        local_90.ID = iVar2;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar6 = (this->target).field_0.p;
  if (pAVar6 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
    if ((uVar10 & 0x20) != 0 || ((this->flags).Value & 0x2000) != 0) {
      return 0;
    }
    if (newstate == (FState *)0x0) {
      newstate = this->SeeState;
    }
    AActor::SetState(this,newstate,false);
    return 0;
  }
LAB_003f4dcd:
  (this->target).field_0.p = (AActor *)0x0;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LookEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(minseedist)	
	PARAM_FLOAT_DEF	(maxseedist)	
	PARAM_FLOAT_DEF (maxheardist)	
	PARAM_ANGLE_DEF (fov)			
	PARAM_STATE_DEF	(seestate)		

	AActor *targ = NULL; // Shuts up gcc
	double dist;
	if (fov == 0) fov = 180.;
	FLookExParams params = { fov, minseedist, maxseedist, maxheardist, flags, seestate };

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator(NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0)
			self->flags5 &= ~MF5_CHASEGOAL;
		else
			self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		if (!(flags & LOF_NOSOUNDCHECK))
		{
			targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)?
				self->Sector->SoundTarget : self->LastHeard;
			if (targ != NULL)
			{
				// [RH] If the soundtarget is dead, don't chase it
				if (targ->health <= 0)
				{
					targ = NULL;
				}
				else
				{
					dist = self->Distance2D (targ);

					// [KS] If the target is too far away, don't respond to the sound.
					if (maxheardist && dist > maxheardist)
					{
						targ = NULL;
						self->LastHeard = NULL;
					}
				}
			}
        }
        
        if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
        {
            return 0;
        }
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			if (!(self->flags4 & MF4_STANDSTILL))
			{
				if (!(flags & LOF_NOSIGHTCHECK))
				{
					// If we find a valid target here, the wandering logic should *not*
					// be activated! If would cause the seestate to be set twice.
					if (P_LookForPlayers(self, true, &params))
						goto seeyou;
				}

				// Let the self wander around aimlessly looking for a fight
                if (!(self->flags & MF_INCHASE))
                {
                    if (seestate)
                    {
                        self->SetState (seestate);
                    }
                    else
                    {
                        if (self->SeeState != NULL)
                        {
                            self->SetState (self->SeeState);
                        }
                        else
                        {
                            A_Wander(self);
                        }
                    }
                }
			}
		}
		else
		{
			self->target = targ; //We already have a target?
            
            // [KS] The target can become ourselves in rare circumstances (like
            // if we committed suicide), so if that's the case, just ignore it.
            if (self->target == self) self->target = NULL;

			if (self->target != NULL)
			{
				if (self->flags & MF_AMBUSH)
				{
					dist = self->Distance2D (self->target);
					if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING) &&
						(!minseedist || dist > minseedist) &&
						(!maxseedist || dist < maxseedist))
					{
						goto seeyou;
					}
				}
				else
					goto seeyou;
			}
		}
	}

	if (!(flags & LOF_NOSIGHTCHECK))
	{
		if (!P_LookForPlayers(self, true, &params))
			return 0;
	}
	else
	{
		return 0;
	}
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound && !(flags & LOF_NOSEESOUND))
	{
		if (flags & LOF_FULLVOLSEESOUND)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target && !(self->flags & MF_INCHASE))
	{
        if (!(flags & LOF_NOJUMP))
        {
            if (seestate)
            {
                self->SetState (seestate);
            }
            else
            {
                self->SetState (self->SeeState);
            }
        }
	}
	return 0;
}